

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ParserPtr __thiscall libcellml::Parser::create(Parser *this,bool strict)

{
  Parser *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParserPtr PVar2;
  bool strict_local;
  shared_ptr<libcellml::Parser> *parser;
  
  this_00 = (Parser *)operator_new(0x20);
  Parser(this_00);
  std::shared_ptr<libcellml::Parser>::shared_ptr<libcellml::Parser,void>
            ((shared_ptr<libcellml::Parser> *)this,this_00);
  peVar1 = std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  Strict::setStrict(&peVar1->super_Strict,strict);
  PVar2.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ParserPtr)PVar2.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ParserPtr Parser::create(bool strict) noexcept
{
    auto parser = std::shared_ptr<Parser> {new Parser {}};
    parser->setStrict(strict);
    return parser;
}